

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_schnorrsig.cpp
# Opt level: O0

void __thiscall SchnorrSig_SetSigHashType_Test::TestBody(SchnorrSig_SetSigHashType_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_b0;
  Message local_a8;
  undefined1 local_9c [20];
  undefined1 local_88 [8];
  AssertionResult gtest_ar;
  allocator local_59;
  string local_58;
  undefined1 local_38 [8];
  SchnorrSignature sig;
  SchnorrSig_SetSigHashType_Test *this_local;
  
  sig._32_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_58,
             "6470fd1303dda4fda717b9837153c24a6eab377183fc438f939e0ed2b620e9ee5077c4a8b8dca28963d772a94f5f0ddf598e1c47c137f91933274c7c3edadce8"
             ,&local_59);
  cfd::core::SchnorrSignature::SchnorrSignature((SchnorrSignature *)local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  cfd::core::SigHashType::SigHashType((SigHashType *)&gtest_ar.message_,kSigHashAll,false,false);
  cfd::core::SchnorrSignature::SetSigHashType
            ((SchnorrSignature *)local_38,(SigHashType *)&gtest_ar.message_);
  local_9c._16_4_ = 1;
  cfd::core::SchnorrSignature::GetSigHashType((SchnorrSignature *)local_9c);
  local_9c._12_4_ = cfd::core::SigHashType::GetSigHashAlgorithm((SigHashType *)local_9c);
  testing::internal::EqHelper<false>::
  Compare<cfd::core::SigHashAlgorithm,cfd::core::SigHashAlgorithm>
            ((EqHelper<false> *)local_88,"SigHashAlgorithm::kSigHashAll",
             "sig.GetSigHashType().GetSigHashAlgorithm()",(SigHashAlgorithm *)(local_9c + 0x10),
             (SigHashAlgorithm *)(local_9c + 0xc));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x61,message);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  cfd::core::SchnorrSignature::~SchnorrSignature((SchnorrSignature *)local_38);
  return;
}

Assistant:

TEST(SchnorrSig, SetSigHashType) {
  SchnorrSignature sig(
    "6470fd1303dda4fda717b9837153c24a6eab377183fc438f939e0ed2b620e9ee"
    "5077c4a8b8dca28963d772a94f5f0ddf598e1c47c137f91933274c7c3edadce8");
  sig.SetSigHashType(SigHashType(SigHashAlgorithm::kSigHashAll));
  EXPECT_EQ(SigHashAlgorithm::kSigHashAll,
      sig.GetSigHashType().GetSigHashAlgorithm());
}